

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall
vkt::sr::ShaderRenderCaseInstance::clearImage
          (ShaderRenderCaseInstance *this,Sampler *refSampler,deUint32 mipLevels,
          deUint32 arrayLayers,VkImage destImage)

{
  CompareMode CVar1;
  deUint32 queueFamilyIndex;
  VkResult VVar2;
  VkDevice device;
  DeviceInterface *vk;
  VkQueue pVVar3;
  VkImageAspectFlags VVar4;
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  VkImageMemoryBarrier postImageBarrier;
  VkImageMemoryBarrier preImageBarrier;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkImageSubresourceRange clearRange;
  VkClearValue clearValue;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  VkSubmitInfo submitInfo;
  
  device = Context::getDevice((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar3 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  CVar1 = refSampler->compare;
  VVar4 = 2 - (CVar1 == COMPAREMODE_NONE);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = (VkDevice)0x0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  clearValue._0_4_ = 0.0;
  clearValue._4_4_ = 0;
  clearValue._8_8_ = 0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&postImageBarrier,vk,device,1,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
  preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
  preImageBarrier.oldLayout = postImageBarrier.oldLayout;
  preImageBarrier.newLayout = postImageBarrier.newLayout;
  preImageBarrier.sType = postImageBarrier.sType;
  preImageBarrier._4_4_ = postImageBarrier._4_4_;
  preImageBarrier.pNext = postImageBarrier.pNext;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0;
  postImageBarrier.dstAccessMask = 0;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)preImageBarrier._16_8_;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)preImageBarrier._24_8_;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       preImageBarrier._0_8_;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)preImageBarrier.pNext;
  if (postImageBarrier._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&postImageBarrier.pNext,
               (VkCommandPool)postImageBarrier._0_8_);
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&postImageBarrier,vk,device,
             (VkCommandPool)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
  preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
  preImageBarrier.oldLayout = postImageBarrier.oldLayout;
  preImageBarrier.newLayout = postImageBarrier.newLayout;
  preImageBarrier.sType = postImageBarrier.sType;
  preImageBarrier._4_4_ = postImageBarrier._4_4_;
  preImageBarrier.pNext = postImageBarrier.pNext;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0;
  postImageBarrier.dstAccessMask = 0;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    submitInfo._0_8_ = cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal);
  }
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)CONCAT44(preImageBarrier.dstAccessMask,preImageBarrier.srcAccessMask);
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._4_4_ =
       preImageBarrier.newLayout;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._0_4_ =
       preImageBarrier.oldLayout;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)preImageBarrier._0_8_;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)preImageBarrier.pNext;
  if (postImageBarrier._0_8_ != 0) {
    preImageBarrier.sType = postImageBarrier.sType;
    preImageBarrier._4_4_ = postImageBarrier._4_4_;
    (**(code **)(*postImageBarrier.pNext + 0x240))
              (postImageBarrier.pNext,postImageBarrier._16_8_,postImageBarrier._24_8_);
  }
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&postImageBarrier,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
  preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
  preImageBarrier.oldLayout = postImageBarrier.oldLayout;
  preImageBarrier.newLayout = postImageBarrier.newLayout;
  preImageBarrier.sType = postImageBarrier.sType;
  preImageBarrier._4_4_ = postImageBarrier._4_4_;
  preImageBarrier.pNext = postImageBarrier.pNext;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0;
  postImageBarrier.dstAccessMask = 0;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
               (VkFence)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal
              );
  }
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)preImageBarrier._16_8_;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)preImageBarrier._24_8_;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
       preImageBarrier._0_8_;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)preImageBarrier.pNext;
  if (postImageBarrier._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&postImageBarrier.pNext,
               (VkFence)postImageBarrier._0_8_);
  }
  preImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  preImageBarrier.pNext = (void *)0x0;
  preImageBarrier.srcAccessMask = 0;
  preImageBarrier.dstAccessMask = 0x1000;
  preImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  preImageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  preImageBarrier.srcQueueFamilyIndex = 0xffffffff;
  preImageBarrier.dstQueueFamilyIndex = 0xffffffff;
  preImageBarrier.subresourceRange.baseMipLevel = 0;
  preImageBarrier.subresourceRange.baseArrayLayer = 0;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0x1000;
  postImageBarrier.dstAccessMask = 0x20;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  postImageBarrier.srcQueueFamilyIndex = 0xffffffff;
  postImageBarrier.dstQueueFamilyIndex = 0xffffffff;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  postImageBarrier.subresourceRange.baseArrayLayer = 0;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext._0_4_ = 0;
  cmdBufferBeginInfo.pNext._4_4_ = 0;
  clearRange.baseMipLevel = 0;
  clearRange.baseArrayLayer = 0;
  postImageBarrier.image.m_internal = destImage.m_internal;
  postImageBarrier.subresourceRange.aspectMask = VVar4;
  postImageBarrier.subresourceRange.levelCount = mipLevels;
  postImageBarrier.subresourceRange.layerCount = arrayLayers;
  preImageBarrier.image.m_internal = destImage.m_internal;
  preImageBarrier.subresourceRange.aspectMask = VVar4;
  preImageBarrier.subresourceRange.levelCount = mipLevels;
  preImageBarrier.subresourceRange.layerCount = arrayLayers;
  clearRange.aspectMask = VVar4;
  clearRange.levelCount = mipLevels;
  clearRange.layerCount = arrayLayers;
  VVar2 = (*vk->_vptr_DeviceInterface[0x49])
                    (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x523);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x4000,0x1000,0,0,0,0
             ,0,1,&preImageBarrier);
  (*vk->_vptr_DeviceInterface[(ulong)(CVar1 != COMPAREMODE_NONE) + 0x66])
            (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,destImage.m_internal,
             7,&clearValue,1,&clearRange);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,1,0,0,0,0,0,1,
             &postImageBarrier);
  VVar2 = (*vk->_vptr_DeviceInterface[0x4a])
                    (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x52e);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&cmdBuffer;
  VVar2 = (*vk->_vptr_DeviceInterface[2])
                    (vk,pVVar3,1,&submitInfo,
                     fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x53d);
  VVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x53e);
  if (fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
               (VkFence)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal
              );
  }
  if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    preImageBarrier._0_8_ = cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::clearImage (const tcu::Sampler&					refSampler,
										   deUint32								mipLevels,
										   deUint32								arrayLayers,
										   VkImage								destImage)
{
	const VkDevice					vkDevice				= m_context.getDevice();
	const DeviceInterface&			vk						= m_context.getDeviceInterface();
	const VkQueue					queue					= m_context.getUniversalQueue();
	const deUint32					queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();

	const bool						isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	Move<VkCommandPool>				cmdPool;
	Move<VkCommandBuffer>			cmdBuffer;
	Move<VkFence>					fence;

	VkClearValue					clearValue;
	deMemset(&clearValue, 0, sizeof(clearValue));


	// Create command pool and buffer
	cmdPool		= createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);
	cmdBuffer	= allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	fence = createFence(vk, vkDevice);

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};


	const VkImageSubresourceRange clearRange		=
	{
		aspectMask,										// VkImageAspectFlags	aspectMask;
		0u,												// deUint32				baseMipLevel;
		mipLevels,										// deUint32				levelCount;
		0u,												// deUint32				baseArrayLayer;
		arrayLayers										// deUint32				layerCount;
	};

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &preImageBarrier);
	if (aspectMask == VK_IMAGE_ASPECT_COLOR_BIT)
	{
		vk.cmdClearColorImage(*cmdBuffer, destImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &clearValue.color, 1, &clearRange);
	}
	else
	{
		vk.cmdClearDepthStencilImage(*cmdBuffer, destImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &clearValue.depthStencil, 1, &clearRange);
	}
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
		DE_NULL,						// const void*					pNext;
		0u,								// deUint32						waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,								// deUint32						commandBufferCount;
		&cmdBuffer.get(),				// const VkCommandBuffer*		pCommandBuffers;
		0u,								// deUint32						signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*			pSignalSemaphores;
	};

	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
}